

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

LogicalType * __thiscall duckdb::ColumnData::RootType(ColumnData *this)

{
  for (; (this->parent).ptr != (ColumnData *)0x0; this = (this->parent).ptr) {
    optional_ptr<duckdb::ColumnData,_true>::CheckValid(&this->parent);
  }
  return &this->type;
}

Assistant:

const LogicalType &ColumnData::RootType() const {
	if (parent) {
		return parent->RootType();
	}
	return type;
}